

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

void __thiscall
clickhouse::ColumnVector<unsigned_int>::ColumnVector(ColumnVector<unsigned_int> *this)

{
  undefined8 *in_RDI;
  TypeRef *in_stack_ffffffffffffffd8;
  Column *in_stack_ffffffffffffffe0;
  
  Type::CreateSimple<unsigned_int>();
  Column::Column(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::shared_ptr<clickhouse::Type>::~shared_ptr((shared_ptr<clickhouse::Type> *)0x216ceb);
  *in_RDI = &PTR__ColumnVector_002a04d8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x216d06);
  return;
}

Assistant:

ColumnVector<T>::ColumnVector()
    : Column(Type::CreateSimple<T>())
{
}